

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O2

DWORD SearchPathW(LPCWSTR lpPath,LPCWSTR lpFileName,LPCWSTR lpExtension,DWORD nBufferLength,
                 LPWSTR lpBuffer,LPWSTR *lpFilePart)

{
  DWORD DVar1;
  int iVar2;
  DWORD DVar3;
  char16_t *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char16_t *pcVar7;
  size_t sVar8;
  size_t __n;
  ulong count;
  SIZE_T SVar9;
  long in_FS_OFFSET;
  undefined1 local_160 [8];
  PathWCharString FullPathPS;
  PathWCharString CanonicalPathPS;
  undefined1 local_78 [8];
  PathCharString AnsiPathPS;
  
  AnsiPathPS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  FullPathPS._64_8_ = local_160;
  FullPathPS.m_size = 0;
  AnsiPathPS._32_8_ = local_78;
  AnsiPathPS.m_size = 0;
  CanonicalPathPS.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0032506a;
  if (lpPath == (LPCWSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","SearchPathW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
            ,0x577);
    pcVar6 = "lpPath may not be NULL\n";
LAB_00324bcf:
    fprintf(_stderr,pcVar6);
LAB_00324be0:
    DVar3 = 0x57;
LAB_00324be3:
    SetLastError(DVar3);
LAB_00324bea:
    DVar1 = 0;
  }
  else {
    if (lpFileName == (LPCWSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","SearchPathW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
              ,0x57d);
      pcVar6 = "lpFileName may not be NULL\n";
      goto LAB_00324bcf;
    }
    if (lpExtension != (LPCWSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","SearchPathW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
              ,0x583);
      fprintf(_stderr,"lpExtension must be NULL, is %p instead\n",lpExtension);
      goto LAB_00324be0;
    }
    if ((*lpFileName == L'\\') || (*lpFileName == L'/')) {
      pcVar4 = StackString<32UL,_char16_t>::OpenStringBuffer
                         ((StackString<32UL,_char16_t> *)&FullPathPS.m_count,0x400);
      DVar3 = 8;
      if (pcVar4 != (char16_t *)0x0) {
        DVar1 = GetFullPathNameW(lpFileName,0x401,pcVar4,(LPWSTR *)0x0);
        FullPathPS.m_count._0_2_ = 0;
        if (0x401 < DVar1) {
          pcVar4 = StackString<32UL,_char16_t>::OpenStringBuffer
                             ((StackString<32UL,_char16_t> *)&FullPathPS.m_count,(ulong)(DVar1 - 1))
          ;
          if (pcVar4 == (char16_t *)0x0) goto LAB_00324be3;
          DVar1 = GetFullPathNameW(lpFileName,DVar1,pcVar4,(LPWSTR *)0x0);
        }
        FullPathPS.m_count._0_2_ = 0;
        if (DVar1 == 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032506a;
          GetLastError();
          goto LAB_00324be0;
        }
        sVar5 = PAL_wcslen(pcVar4);
        SVar9 = (long)MaxWCharToAcpLengthRatio * (sVar5 + 1);
        pcVar6 = StackString<32UL,_char>::OpenStringBuffer
                           ((StackString<32UL,_char> *)local_78,SVar9);
        if (pcVar6 != (char *)0x0) {
          iVar2 = WideCharToMultiByte(0,0,pcVar4,-1,pcVar6,(int)SVar9,(LPCSTR)0x0,(LPBOOL)0x0);
          if ((ulong)(long)iVar2 < AnsiPathPS.m_size) {
            AnsiPathPS.m_size = (long)iVar2;
          }
          *(undefined1 *)(AnsiPathPS._32_8_ + AnsiPathPS.m_size) = 0;
          iVar2 = access(pcVar6,0);
          DVar3 = 2;
          if (iVar2 == 0) goto LAB_00324d94;
        }
      }
      goto LAB_00324be3;
    }
    sVar5 = PAL_wcslen(lpFileName);
LAB_00324e13:
    do {
      do {
        while( true ) {
          pcVar4 = lpPath;
          if (*pcVar4 == L'\0') {
            DVar3 = 2;
            goto LAB_00324be3;
          }
          pcVar7 = PAL_wcschr(pcVar4,L':');
          if (pcVar7 == (char16_t *)0x0) {
            sVar8 = PAL_wcslen(pcVar4);
            pcVar7 = pcVar4 + sVar8;
            lpPath = pcVar7;
          }
          else {
            lpPath = pcVar7 + 1;
          }
          __n = (long)pcVar7 - (long)pcVar4;
          count = ((long)__n >> 1) + sVar5 + 1;
          if (count < 0x400) break;
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032506a;
        }
      } while (pcVar7 == pcVar4);
      pcVar7 = StackString<32UL,_char16_t>::OpenStringBuffer
                         ((StackString<32UL,_char16_t> *)local_160,count);
      if (pcVar7 == (char16_t *)0x0) {
LAB_00325037:
        SetLastError(8);
        goto LAB_00324bea;
      }
      memcpy(pcVar7,pcVar4,__n);
      *(undefined2 *)((long)pcVar7 + __n) = 0x2f;
      PAL_wcscpy((char16_t *)((long)pcVar7 + __n + 2),lpFileName);
      if (count < FullPathPS.m_size) {
        FullPathPS.m_size = count;
      }
      *(undefined2 *)(FullPathPS._64_8_ + FullPathPS.m_size * 2) = 0;
      pcVar4 = StackString<32UL,_char16_t>::OpenStringBuffer
                         ((StackString<32UL,_char16_t> *)&FullPathPS.m_count,0x400);
      if (pcVar4 == (char16_t *)0x0) goto LAB_00325037;
      DVar3 = GetFullPathNameW(pcVar7,0x401,pcVar4,(LPWSTR *)0x0);
      if (DVar3 < CanonicalPathPS.m_size) {
        CanonicalPathPS.m_size = (ulong)DVar3;
      }
      FullPathPS.m_innerBuffer[CanonicalPathPS.m_size + 0x2c] = L'\0';
      if (0x401 < DVar3) {
        pcVar4 = StackString<32UL,_char16_t>::OpenStringBuffer
                           ((StackString<32UL,_char16_t> *)&FullPathPS.m_count,(ulong)(DVar3 - 1));
        if (pcVar4 == (char16_t *)0x0) goto LAB_00325037;
        DVar3 = GetFullPathNameW(pcVar7,DVar3,pcVar4,(LPWSTR *)0x0);
        if (DVar3 < CanonicalPathPS.m_size) {
          CanonicalPathPS.m_size = (ulong)DVar3;
        }
        FullPathPS.m_innerBuffer[CanonicalPathPS.m_size + 0x2c] = L'\0';
      }
      if (DVar3 == 0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032506a;
        GetLastError();
        goto LAB_00324e13;
      }
      sVar8 = PAL_wcslen(pcVar4);
      SVar9 = (long)MaxWCharToAcpLengthRatio * (sVar8 + 1);
      pcVar6 = StackString<32UL,_char>::OpenStringBuffer((StackString<32UL,_char> *)local_78,SVar9);
      if (pcVar6 == (char *)0x0) goto LAB_00325037;
      iVar2 = WideCharToMultiByte(0,0,pcVar4,-1,pcVar6,(int)SVar9,(LPCSTR)0x0,(LPBOOL)0x0);
      if ((ulong)(long)iVar2 < AnsiPathPS.m_size) {
        AnsiPathPS.m_size = (long)iVar2;
      }
      *(undefined1 *)(AnsiPathPS._32_8_ + AnsiPathPS.m_size) = 0;
      iVar2 = access(pcVar6,0);
    } while (iVar2 != 0);
LAB_00324d94:
    sVar5 = PAL_wcslen(pcVar4);
    DVar3 = (DWORD)sVar5;
    DVar1 = DVar3 + 1;
    if (DVar3 + 1 <= nBufferLength) {
      if (lpBuffer == (LPWSTR)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032506a;
        goto LAB_00324be0;
      }
      PAL_wcscpy(lpBuffer,pcVar4);
      DVar1 = DVar3;
      if (lpFilePart != (LPWSTR *)0x0) {
        pcVar4 = PAL_wcsrchr(lpBuffer,L'/');
        *lpFilePart = pcVar4;
        if (pcVar4 == (char16_t *)0x0) {
          fprintf(_stderr,"] %s %s:%d","SearchPathW",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                  ,0x64b);
          fprintf(_stderr,"no \'/\' in full path!\n");
        }
        else {
          *lpFilePart = pcVar4 + 1;
        }
      }
    }
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char16_t>::~StackString((StackString<32UL,_char16_t> *)&FullPathPS.m_count);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_78);
    StackString<32UL,_char16_t>::~StackString((StackString<32UL,_char16_t> *)local_160);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != AnsiPathPS.m_count) {
      __stack_chk_fail();
    }
    return DVar1;
  }
LAB_0032506a:
  abort();
}

Assistant:

DWORD
PALAPI
SearchPathW(
    IN LPCWSTR lpPath,
    IN LPCWSTR lpFileName,
    IN LPCWSTR lpExtension,
    IN DWORD nBufferLength,
    OUT LPWSTR lpBuffer,
    OUT LPWSTR *lpFilePart
    )
{
    DWORD nRet = 0;
    WCHAR * FullPath;
    size_t FullPathLength = 0;
    PathWCharString FullPathPS;
    LPCWSTR pPathStart;
    LPCWSTR pPathEnd;
    size_t PathLength;
    size_t FileNameLength;
    DWORD dw;
    DWORD length;
    char * AnsiPath;
    PathCharString AnsiPathPS;
    size_t CanonicalPathLength;
    int canonical_size;
    WCHAR * CanonicalPath;
    PathWCharString CanonicalPathPS;

    PERF_ENTRY(SearchPathW);
    ENTRY("SearchPathW(lpPath=%p (%S), lpFileName=%p (%S), lpExtension=%p, "
          "nBufferLength=%u, lpBuffer=%p, lpFilePart=%p)\n",
	  lpPath,
	  lpPath, lpFileName, lpFileName, lpExtension, nBufferLength, lpBuffer,
          lpFilePart);

    /* validate parameters */

    if(NULL == lpPath)
    {
        ASSERT("lpPath may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL == lpFileName)
    {
        ASSERT("lpFileName may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL != lpExtension)
    {
        ASSERT("lpExtension must be NULL, is %p instead\n", lpExtension);
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    /* special case : if file name contains absolute path, don't search the
       provided path */
    if('\\' == lpFileName[0] || '/' == lpFileName[0])
    {
        /* Canonicalize the path to deal with back-to-back '/', etc. */
        length = MAX_LONGPATH;
        CanonicalPath = CanonicalPathPS.OpenStringBuffer(length);
        if (NULL == CanonicalPath)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
        dw = GetFullPathNameW(lpFileName, length+1, CanonicalPath, NULL);
        CanonicalPathPS.CloseBuffer(dw);
        if (length+1 < dw)
        {
            CanonicalPath = CanonicalPathPS.OpenStringBuffer(dw-1);
            if (NULL == CanonicalPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameW(lpFileName, dw, CanonicalPath, NULL);
            CanonicalPathPS.CloseBuffer(dw);
        }

        if (dw == 0)
        {
            WARN("couldn't canonicalize path <%S>, error is %#x. failing.\n",
                 lpPath, GetLastError());
            SetLastError(ERROR_INVALID_PARAMETER);
            goto done;
        }

        /* see if the file exists */
        CanonicalPathLength = (PAL_wcslen(CanonicalPath)+1) * MaxWCharToAcpLengthRatio;
        AnsiPath = AnsiPathPS.OpenStringBuffer(CanonicalPathLength);
        if (NULL == AnsiPath)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
	    canonical_size = WideCharToMultiByte(CP_ACP, 0, CanonicalPath, -1,
			    AnsiPath, CanonicalPathLength, NULL, NULL);
	    AnsiPathPS.CloseBuffer(canonical_size);

        if(0 == access(AnsiPath, F_OK))
        {
            /* found it */
            nRet = dw;
        }
    }
    else
    {
        LPCWSTR pNextPath;

        pNextPath = lpPath;

        FileNameLength = PAL_wcslen(lpFileName);

        while (*pNextPath)
        {
            pPathStart = pNextPath;

            /* get a pointer to the end of the first path in pPathStart */
            pPathEnd = PAL_wcschr(pPathStart, ':');
            if (!pPathEnd)
            {
                pPathEnd = pPathStart + PAL_wcslen(pPathStart);
                /* we want to break out of the loop after this pass, so let
                   *pNextPath be '\0' */
                pNextPath = pPathEnd;
            }
            else
            {
                /* point to the next component in the path string */
                pNextPath = pPathEnd+1;
            }

            PathLength = pPathEnd-pPathStart;

            if (PathLength+FileNameLength+1 >= MAX_LONGPATH)
            {
                /* The path+'/'+file length is too long.  Skip it. */
                WARN("path component %.*S is too long, skipping it\n",
                     (int)PathLength, pPathStart);
                continue;
            }
            else if(0 == PathLength)
            {
                /* empty component : there were 2 consecutive ':' */
                continue;
            }

            /* Construct a pathname by concatenating one path from lpPath, '/'
               and lpFileName */
            FullPathLength = PathLength + FileNameLength;
            FullPath = FullPathPS.OpenStringBuffer(FullPathLength+1);
            if (NULL == FullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            memcpy(FullPath, pPathStart, PathLength*sizeof(WCHAR));
            FullPath[PathLength] = '/';
            PAL_wcscpy(&FullPath[PathLength+1], lpFileName);

            FullPathPS.CloseBuffer(FullPathLength+1);

            /* Canonicalize the path to deal with back-to-back '/', etc. */
            length = MAX_LONGPATH;
            CanonicalPath = CanonicalPathPS.OpenStringBuffer(length);
            if (NULL == CanonicalPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameW(FullPath, length+1,
                                  CanonicalPath, NULL);
            CanonicalPathPS.CloseBuffer(dw);

            if (length+1 < dw)
            {
                CanonicalPath = CanonicalPathPS.OpenStringBuffer(dw-1);
                if (NULL == CanonicalPath)
                {
                    SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    goto done;
                }
                dw = GetFullPathNameW(FullPath, dw, CanonicalPath, NULL);
                CanonicalPathPS.CloseBuffer(dw);
            }

            if (dw == 0)
            {
                /* Call failed - possibly low memory.  Skip the path */
                WARN("couldn't canonicalize path <%S>, error is %#x. "
                     "skipping it\n", FullPath, GetLastError());
                continue;
            }

            /* see if the file exists */
            CanonicalPathLength = (PAL_wcslen(CanonicalPath)+1) * MaxWCharToAcpLengthRatio;
            AnsiPath = AnsiPathPS.OpenStringBuffer(CanonicalPathLength);
            if (NULL == AnsiPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            canonical_size = WideCharToMultiByte(CP_ACP, 0, CanonicalPath, -1,
                                AnsiPath, CanonicalPathLength, NULL, NULL);
            AnsiPathPS.CloseBuffer(canonical_size);

            if(0 == access(AnsiPath, F_OK))
            {
                /* found it */
                nRet = dw;
                break;
            }
        }
    }

    if (nRet == 0)
    {
       /* file not found anywhere; say so. in Windows, this always seems to say
          FILE_NOT_FOUND, even if path doesn't exist */
       SetLastError(ERROR_FILE_NOT_FOUND);
    }
    else
    {
        /* find out the required buffer size, copy path to buffer if it's
           large enough */
        nRet = PAL_wcslen(CanonicalPath)+1;
        if(nRet <= nBufferLength)
        {
            if(NULL == lpBuffer)
            {
                /* Windows merily crashes here, but let's not */
                ERROR("caller told us buffer size was %d, but buffer is NULL\n",
                      nBufferLength);
                SetLastError(ERROR_INVALID_PARAMETER);
                nRet = 0;
                goto done;
            }
            PAL_wcscpy(lpBuffer, CanonicalPath);

            /* don't include the null-terminator in the count if buffer was
               large enough */
            nRet--;

            if(NULL != lpFilePart)
            {
                *lpFilePart = PAL_wcsrchr(lpBuffer, '/');
                if(NULL == *lpFilePart)
                {
                    ASSERT("no '/' in full path!\n");
                }
                else
                {
                    /* point to character after last '/' */
                    (*lpFilePart)++;
                }
            }
        }
    }
done:
    LOGEXIT("SearchPathW returns DWORD %u\n", nRet);
    PERF_EXIT(SearchPathW);
    return nRet;
}